

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

vector<duckdb::ParserKeyword,_true> * duckdb::Parser::KeywordList(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_> *in_RDI;
  pointer pPVar2;
  ParserKeyword res;
  vector<duckdb_libpgquery::PGKeyword,_true> keywords;
  value_type local_68;
  vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_> local_40;
  
  PostgresParser::KeywordList();
  (in_RDI->super__Vector_base<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40.
      super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_68.name.field_2;
    pPVar2 = local_40.
             super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_68.name._M_string_length = 0;
      local_68.name.field_2._M_local_buf[0] = '\0';
      local_68.name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_assign((string *)&local_68);
      local_68.category = ToKeywordCategory(pPVar2->category);
      ::std::vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>::push_back
                (in_RDI,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_68.name._M_dataplus._M_p);
      }
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != local_40.
                       super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>::
  ~vector(&local_40);
  return (vector<duckdb::ParserKeyword,_true> *)in_RDI;
}

Assistant:

vector<ParserKeyword> Parser::KeywordList() {
	auto keywords = PostgresParser::KeywordList();
	vector<ParserKeyword> result;
	for (auto &kw : keywords) {
		ParserKeyword res;
		res.name = kw.text;
		res.category = ToKeywordCategory(kw.category);
		result.push_back(res);
	}
	return result;
}